

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O0

PaError PaAlsaStreamComponent_InitialConfigure
                  (PaAlsaStreamComponent *self,PaStreamParameters *params,int primeBuffers,
                  snd_pcm_hw_params_t *hwParams,double *sampleRate)

{
  int iVar1;
  int iVar2;
  pthread_t pVar3;
  undefined8 in_RCX;
  long in_RDI;
  undefined8 *in_R8;
  int __pa_unsure_error_id_5;
  int __pa_unsure_error_id_4;
  int __pa_unsure_error_id_3;
  int err;
  int __pa_unsure_error_id_2;
  int __pa_unsure_error_id_1;
  int __pa_unsure_error_id;
  uint minPeriods;
  double sr;
  snd_pcm_t *pcm;
  int dir;
  snd_pcm_access_t alternateAccessMode;
  snd_pcm_access_t accessMode;
  PaError result;
  long in_stack_ffffffffffffff58;
  undefined8 in_stack_ffffffffffffff60;
  PaHostApiTypeId PVar4;
  double *in_stack_ffffffffffffff68;
  snd_pcm_hw_params_t *in_stack_ffffffffffffff70;
  bool local_82;
  bool local_81;
  double in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa4;
  undefined4 local_4c;
  undefined8 local_48;
  undefined8 local_40;
  undefined4 local_38;
  undefined4 local_34;
  undefined4 local_30;
  PaError local_2c;
  undefined8 *local_28;
  undefined8 local_20;
  long local_8;
  
  PVar4 = (PaHostApiTypeId)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  local_2c = 0;
  local_38 = 0;
  local_40 = *(undefined8 *)(in_RDI + 0x38);
  local_48 = *in_R8;
  local_4c = 2;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_8 = in_RDI;
  iVar1 = (*(code *)alsa_snd_pcm_hw_params_any)(local_40,in_RCX);
  if (iVar1 < 0) {
    pVar3 = pthread_self();
    iVar2 = pthread_equal(pVar3,paUnixMainThread);
    if (iVar2 != 0) {
      (*alsa_snd_strerror)(iVar1);
      PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffff58,(char *)0x11921b);
    }
    PaUtil_DebugPrint(
                     "Expression \'alsa_snd_pcm_hw_params_any( pcm, hwParams )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1974\n"
                     );
    local_2c = -9999;
  }
  else {
    iVar1 = (*(code *)alsa_snd_pcm_hw_params_set_periods_integer)(local_40,local_20);
    if (iVar1 < 0) {
      pVar3 = pthread_self();
      iVar2 = pthread_equal(pVar3,paUnixMainThread);
      if (iVar2 != 0) {
        (*alsa_snd_strerror)(iVar1);
        PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffff58,(char *)0x1192ac);
      }
      PaUtil_DebugPrint(
                       "Expression \'alsa_snd_pcm_hw_params_set_periods_integer( pcm, hwParams )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1976\n"
                       );
      local_2c = -9999;
    }
    else {
      local_38 = 0;
      iVar1 = (*(code *)alsa_snd_pcm_hw_params_set_periods_min)
                        (local_40,local_20,&local_4c,&local_38);
      if (iVar1 < 0) {
        pVar3 = pthread_self();
        iVar2 = pthread_equal(pVar3,paUnixMainThread);
        if (iVar2 != 0) {
          (*alsa_snd_strerror)(iVar1);
          PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffff58,(char *)0x11934d);
        }
        PaUtil_DebugPrint(
                         "Expression \'alsa_snd_pcm_hw_params_set_periods_min( pcm, hwParams, &minPeriods, &dir )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1979\n"
                         );
        local_2c = -9999;
      }
      else {
        if (*(int *)(local_8 + 0x10) == 0) {
          local_30 = 1;
          local_34 = 0;
          iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_access)(local_40,local_20,1);
          local_82 = true;
          if (iVar1 < 0) {
            iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_access)(local_40,local_20,local_34);
            local_82 = -1 < iVar1;
          }
          *(uint *)(local_8 + 0x18) = (uint)local_82;
          if (*(int *)(local_8 + 0x18) == 0) {
            local_30 = 4;
            local_34 = 3;
          }
        }
        else {
          local_30 = 0;
          local_34 = 1;
          iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_access)(local_40,local_20,0);
          local_81 = true;
          if (iVar1 < 0) {
            iVar1 = (*(code *)alsa_snd_pcm_hw_params_test_access)(local_40,local_20,local_34);
            local_81 = -1 < iVar1;
          }
          *(uint *)(local_8 + 0x18) = (uint)local_81;
          if (*(int *)(local_8 + 0x18) == 0) {
            local_30 = 3;
            local_34 = 4;
          }
        }
        iVar1 = (*(code *)alsa_snd_pcm_hw_params_set_access)(local_40,local_20,local_30);
        if (iVar1 < 0) {
          in_stack_ffffffffffffffa4 =
               (*(code *)alsa_snd_pcm_hw_params_set_access)(local_40,local_20,local_34);
          if (in_stack_ffffffffffffffa4 < 0) {
            local_2c = -9999;
            (*alsa_snd_strerror)(in_stack_ffffffffffffffa4);
            PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffff58,(char *)0x11951c);
            return local_2c;
          }
          *(uint *)(local_8 + 0x14) = (uint)((*(int *)(local_8 + 0x10) != 0 ^ 0xffU) & 1);
        }
        iVar1 = (*(code *)alsa_snd_pcm_hw_params_set_format)
                          (local_40,local_20,*(undefined4 *)(local_8 + 0x50));
        if (iVar1 < 0) {
          pVar3 = pthread_self();
          iVar2 = pthread_equal(pVar3,paUnixMainThread);
          if (iVar2 != 0) {
            (*alsa_snd_strerror)(iVar1);
            PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffff58,(char *)0x1195c1);
          }
          PaUtil_DebugPrint(
                           "Expression \'alsa_snd_pcm_hw_params_set_format( pcm, hwParams, self->nativeFormat )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2035\n"
                           );
          local_2c = -9999;
        }
        else {
          local_2c = SetApproximateSampleRate
                               ((snd_pcm_t *)CONCAT44(in_stack_ffffffffffffffa4,iVar1),
                                (snd_pcm_hw_params_t *)
                                CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                                in_stack_ffffffffffffff90);
          if (local_2c == -9999) {
            paUtilErr_ = -9999;
            PaUtil_DebugPrint(
                             "Expression \'paUnanticipatedHostError\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2048\n"
                             );
            local_2c = paUtilErr_;
          }
          else {
            iVar1 = GetExactSampleRate(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
            if (iVar1 < 0) {
              pVar3 = pthread_self();
              iVar2 = pthread_equal(pVar3,paUnixMainThread);
              if (iVar2 != 0) {
                PVar4 = iVar1 >> 0x1f;
                (*alsa_snd_strerror)(iVar1);
                PaUtil_SetLastHostErrorInfo(PVar4,in_stack_ffffffffffffff58,(char *)0x119675);
              }
              PaUtil_DebugPrint(
                               "Expression \'GetExactSampleRate( hwParams, &sr )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2039\n"
                               );
              local_2c = -9999;
            }
            else if (local_2c == -0x270d) {
              paUtilErr_ = -0x270d;
              PaUtil_DebugPrint(
                               "Expression \'paInvalidSampleRate\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2043\n"
                               );
              local_2c = paUtilErr_;
            }
            else {
              iVar1 = (*(code *)alsa_snd_pcm_hw_params_set_channels)
                                (local_40,local_20,*(undefined4 *)(local_8 + 0xc));
              if (iVar1 < 0) {
                PaUtil_DebugPrint(
                                 "Expression \'alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, self->numHostChannels )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 2051\n"
                                 );
                local_2c = -0x270e;
              }
              else {
                *local_28 = local_48;
              }
            }
          }
        }
      }
    }
  }
  return local_2c;
}

Assistant:

static PaError PaAlsaStreamComponent_InitialConfigure( PaAlsaStreamComponent *self, const PaStreamParameters *params,
        int primeBuffers, snd_pcm_hw_params_t *hwParams, double *sampleRate )
{
    /* Configuration consists of setting all of ALSA's parameters.
     * These parameters come in two flavors: hardware parameters
     * and software paramters.  Hardware parameters will affect
     * the way the device is initialized, software parameters
     * affect the way ALSA interacts with me, the user-level client.
     */

    PaError result = paNoError;
    snd_pcm_access_t accessMode, alternateAccessMode;
    int dir = 0;
    snd_pcm_t *pcm = self->pcm;
    double sr = *sampleRate;
    unsigned int minPeriods = 2;

    /* self->framesPerPeriod = framesPerHostBuffer; */

    /* ... fill up the configuration space with all possibile
     * combinations of parameters this device will accept */
    ENSURE_( alsa_snd_pcm_hw_params_any( pcm, hwParams ), paUnanticipatedHostError );

    ENSURE_( alsa_snd_pcm_hw_params_set_periods_integer( pcm, hwParams ), paUnanticipatedHostError );
    /* I think there should be at least 2 periods (even though ALSA doesn't appear to enforce this) */
    dir = 0;
    ENSURE_( alsa_snd_pcm_hw_params_set_periods_min( pcm, hwParams, &minPeriods, &dir ), paUnanticipatedHostError );

    if( self->userInterleaved )
    {
        accessMode          = SND_PCM_ACCESS_MMAP_INTERLEAVED;
        alternateAccessMode = SND_PCM_ACCESS_MMAP_NONINTERLEAVED;

        /* test if MMAP supported */
        self->canMmap = alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ||
                        alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0;

        PA_DEBUG(( "%s: device MMAP SND_PCM_ACCESS_MMAP_INTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ? "YES" : "NO" ) ));
        PA_DEBUG(( "%s: device MMAP SND_PCM_ACCESS_MMAP_NONINTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0 ? "YES" : "NO" ) ));

        if( !self->canMmap )
        {
            accessMode          = SND_PCM_ACCESS_RW_INTERLEAVED;
            alternateAccessMode = SND_PCM_ACCESS_RW_NONINTERLEAVED;
        }
    }
    else
    {
        accessMode          = SND_PCM_ACCESS_MMAP_NONINTERLEAVED;
        alternateAccessMode = SND_PCM_ACCESS_MMAP_INTERLEAVED;

        /* test if MMAP supported */
        self->canMmap = alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ||
                        alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0;

        PA_DEBUG((" %s: device MMAP SND_PCM_ACCESS_MMAP_NONINTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, accessMode ) >= 0 ? "YES" : "NO" ) ));
        PA_DEBUG(( "%s: device MMAP SND_PCM_ACCESS_MMAP_INTERLEAVED: %s\n", __FUNCTION__, ( alsa_snd_pcm_hw_params_test_access( pcm, hwParams, alternateAccessMode ) >= 0 ? "YES" : "NO" ) ));

        if( !self->canMmap )
        {
            accessMode          = SND_PCM_ACCESS_RW_NONINTERLEAVED;
            alternateAccessMode = SND_PCM_ACCESS_RW_INTERLEAVED;
        }
    }

    PA_DEBUG(( "%s: device can MMAP: %s\n", __FUNCTION__, ( self->canMmap ? "YES" : "NO" ) ));

    /* If requested access mode fails, try alternate mode */
    if( alsa_snd_pcm_hw_params_set_access( pcm, hwParams, accessMode ) < 0 )
    {
        int err = 0;
        if( ( err = alsa_snd_pcm_hw_params_set_access( pcm, hwParams, alternateAccessMode )) < 0 )
        {
            result = paUnanticipatedHostError;
            PaUtil_SetLastHostErrorInfo( paALSA, err, alsa_snd_strerror( err ) );
            goto error;
        }
        /* Flip mode */
        self->hostInterleaved = !self->userInterleaved;
    }

    /* Some specific hardware (reported: Audio8 DJ) can fail with assertion during this step. */
    ENSURE_( alsa_snd_pcm_hw_params_set_format( pcm, hwParams, self->nativeFormat ), paUnanticipatedHostError );

    if( ( result = SetApproximateSampleRate( pcm, hwParams, sr )) != paUnanticipatedHostError )
    {
        ENSURE_( GetExactSampleRate( hwParams, &sr ), paUnanticipatedHostError );
        if( result == paInvalidSampleRate ) /* From the SetApproximateSampleRate() call above */
        { /* The sample rate was returned as 'out of tolerance' of the one requested */
            PA_DEBUG(( "%s: Wanted %.3f, closest sample rate was %.3f\n", __FUNCTION__, sampleRate, sr ));
            PA_ENSURE( paInvalidSampleRate );
        }
    }
    else
    {
       PA_ENSURE( paUnanticipatedHostError );
    }

    ENSURE_( alsa_snd_pcm_hw_params_set_channels( pcm, hwParams, self->numHostChannels ), paInvalidChannelCount );

    *sampleRate = sr;

end:
    return result;

error:
    /* No particular action */
    goto end;
}